

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

void __thiscall Arcflow::finalize(Arcflow *this)

{
  NodeSet *this_00;
  pointer *ppAVar1;
  vector<int,std::allocator<int>> *this_01;
  int iVar2;
  iterator iVar3;
  pointer pvVar4;
  int *piVar5;
  iterator iVar6;
  int *piVar7;
  pointer piVar8;
  pointer pAVar9;
  pointer pIVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int iVar11;
  int iVar12;
  iterator __end1;
  ulong uVar13;
  runtime_error *this_02;
  byte bVar14;
  iterator __begin1;
  ulong uVar15;
  pointer pAVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  size_type sVar21;
  int *piVar22;
  ulong uVar23;
  int *piVar24;
  int *piVar25;
  int iVar26;
  ulong uVar27;
  ulong *puVar28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  size_t __n;
  vector<int,_std::allocator<int>_> torder;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bigger_than;
  char _error_msg_ [256];
  Arc local_194;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  iterator iStack_180;
  int *local_178;
  vector<int,_std::allocator<int>_> local_168;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_150;
  vector<bool,_std::allocator<bool>_> local_138 [6];
  
  if (this->ready != false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1b9);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,(char *)local_138);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar11 = (this->inst).nbtypes;
  this->S = 0;
  if (iVar11 == 1) {
    this_00 = &this->NS;
    iVar11 = NodeSet::size(this_00);
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,iVar11);
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&this->Ts,local_138);
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(this->S,*(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
    iVar3._M_current =
         (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                (&this->A,iVar3,(Arc *)local_138);
    }
    else {
      (iVar3._M_current)->label =
           local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      *(_Bit_type **)iVar3._M_current =
           local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
      ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    iVar11 = NodeSet::size(this_00);
    if (1 < iVar11) {
      iVar11 = 1;
      do {
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
        local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             CONCAT44(*(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,iVar11);
        iVar3._M_current =
             (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar3._M_current ==
            (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                    (&this->A,iVar3,(Arc *)local_138);
        }
        else {
          (iVar3._M_current)->label =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
          *(_Bit_type **)iVar3._M_current =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        iVar11 = iVar11 + 1;
        iVar12 = NodeSet::size(this_00);
      } while (iVar11 < iVar12);
    }
    goto LAB_0010a85f;
  }
  local_188._M_current = (int *)0x0;
  iStack_180._M_current = (int *)0x0;
  local_178 = (int *)0x0;
  local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ << 0x20);
  if (0 < iVar11) {
    iVar11 = 0;
    do {
      if (iStack_180._M_current == local_178) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_188,iStack_180,(int *)local_138);
      }
      else {
        *iStack_180._M_current = iVar11;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
      iVar6._M_current = iStack_180._M_current;
      __first._M_current = local_188._M_current;
      iVar11 = (int)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,iVar11);
    } while (iVar11 < (this->inst).nbtypes);
    if (local_188._M_current != iStack_180._M_current) {
      lVar19 = (long)iStack_180._M_current - (long)local_188._M_current;
      uVar13 = lVar19 >> 2;
      lVar20 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                (local_188,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_180._M_current,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                  )this);
      if (lVar19 < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  (__first,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           iVar6._M_current,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
      }
      else {
        __last._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::finalize()::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                    )this);
        for (; __last._M_current != iVar6._M_current; __last._M_current = __last._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<Arcflow::finalize()::__0>>
                    (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:455:21)>
                             )this);
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)(this->inst).nbtypes);
  iVar11 = (this->inst).nbtypes;
  if (iVar11 < 1) {
LAB_0010a2b6:
    sVar21 = (size_type)iVar11;
  }
  else {
    lVar20 = 0;
    do {
      iVar11 = NodeSet::size(&this->NS);
      (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_188._M_current[lVar20]] = iVar11 + (int)lVar20;
      lVar20 = lVar20 + 1;
      iVar11 = (this->inst).nbtypes;
    } while (lVar20 < iVar11);
    if (iVar11 < 1) goto LAB_0010a2b6;
    lVar20 = 0;
    do {
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = this->LOSS;
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(this->S,(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20]);
      iVar3._M_current =
           (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar3._M_current ==
          (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                  (&this->A,iVar3,(Arc *)local_138);
      }
      else {
        (iVar3._M_current)->label =
             local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
        *(_Bit_type **)iVar3._M_current =
             local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      lVar20 = lVar20 + 1;
      sVar21 = (size_type)(this->inst).nbtypes;
    } while (lVar20 < (long)sVar21);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_150,sVar21,(allocator_type *)local_138);
  iVar11 = (this->inst).nbtypes;
  sVar21 = (size_type)iVar11;
  if (0 < (long)sVar21) {
    uVar13 = 0;
    do {
      local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffff00000000);
      if (0 < iVar11) {
        uVar15 = 0;
        do {
          if (uVar13 != uVar15) {
            pvVar4 = (this->inst).Ws.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar20 = (long)(int)uVar15;
            uVar17 = (ulong)(this->inst).ndims;
            piVar25 = pvVar4[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar5 = pvVar4[lVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((long)uVar17 < 1) {
LAB_0010a369:
              piVar22 = *(pointer *)
                         ((long)&pvVar4[uVar13].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data + 8);
              __n = (long)piVar22 - (long)piVar25;
              if (__n == (long)*(pointer *)
                                ((long)&pvVar4[lVar20].super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data + 8) - (long)piVar5) {
                if (piVar22 == piVar25) {
                  if ((long)uVar13 < lVar20) goto LAB_0010a3c1;
                }
                else {
                  iVar11 = bcmp(piVar25,piVar5,__n);
                  if ((iVar11 != 0) ||
                     (((long)uVar13 < lVar20 && (iVar11 = bcmp(piVar25,piVar5,__n), iVar11 == 0))))
                  goto LAB_0010a3c1;
                }
              }
              else {
LAB_0010a3c1:
                this_01 = (vector<int,std::allocator<int>> *)
                          (local_150.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar13);
                iVar6._M_current = *(int **)(this_01 + 8);
                if (iVar6._M_current == *(int **)(this_01 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_01,iVar6,(int *)local_138);
                }
                else {
                  *iVar6._M_current = (int)uVar15;
                  *(int **)(this_01 + 8) = iVar6._M_current + 1;
                }
              }
            }
            else if (*piVar25 <= *piVar5) {
              uVar27 = 1;
              do {
                uVar23 = uVar27;
                if (uVar17 == uVar23) break;
                uVar27 = uVar23 + 1;
              } while (piVar25[uVar23] <= piVar5[uVar23]);
              if (uVar17 <= uVar23) goto LAB_0010a369;
            }
          }
          uVar18 = (int)local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
          uVar15 = (ulong)uVar18;
          local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p =
               (_Bit_type *)
               CONCAT44(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar18
                       );
          iVar11 = (this->inst).nbtypes;
        } while ((int)uVar18 < iVar11);
      }
      uVar13 = uVar13 + 1;
      sVar21 = (size_type)iVar11;
    } while ((long)uVar13 < (long)sVar21);
  }
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = (uint)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (local_138,sVar21,(bool *)&local_168,(allocator_type *)&local_194);
  for (iVar11 = 1; iVar12 = NodeSet::size(&this->NS), iVar11 < iVar12; iVar11 = iVar11 + 1) {
    NodeSet::get_label(&local_168,&this->NS,iVar11);
    iVar12 = (this->inst).nbtypes;
    uVar13 = (ulong)iVar12;
    if (0 < (long)uVar13) {
      uVar18 = (this->inst).ndims;
      pvVar4 = (this->inst).Ws.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = 0;
      do {
        bVar14 = (byte)uVar15;
        if ((int)uVar18 < 1) {
          puVar28 = local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar15 >> 6);
          uVar17 = 1L << (bVar14 & 0x3f);
LAB_0010a51c:
          uVar17 = uVar17 | *puVar28;
        }
        else {
          piVar25 = pvVar4[uVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (*piVar25 <
              *(int *)CONCAT44(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (uint)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start)) {
            puVar28 = local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (uVar15 >> 6);
            uVar17 = 1L << (bVar14 & 0x3f);
          }
          else {
            uVar17 = 1;
            do {
              uVar27 = uVar17;
              if (uVar18 == uVar27) break;
              uVar17 = uVar27 + 1;
            } while (((int *)CONCAT44(local_168.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (uint)local_168.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start))[uVar27] <=
                     piVar25[uVar27]);
            uVar17 = 1L << (bVar14 & 0x3f);
            puVar28 = local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (uVar15 >> 6);
            if (uVar18 <= uVar27) goto LAB_0010a51c;
          }
          uVar17 = ~uVar17 & *puVar28;
        }
        *puVar28 = uVar17;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
      if (0 < iVar12) {
        uVar15 = 0;
        do {
          if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [uVar15 >> 6 & 0x3ffffff] >> (uVar15 & 0x3f) & 1) != 0) {
            piVar5 = local_150.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar25 = local_150.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar25 != piVar5;
                piVar25 = piVar25 + 1) {
              iVar2 = *piVar25;
              iVar26 = iVar2 + 0x3f;
              if (-1 < (long)iVar2) {
                iVar26 = iVar2;
              }
              bVar14 = (byte)iVar2 & 0x3f;
              local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [(long)(iVar26 >> 6) +
               ((ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                   local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)(iVar26 >> 6) +
                    ((ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) - 1)] &
                   (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
        if (0 < iVar12) {
          uVar15 = 0;
          do {
            if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [uVar15 >> 6 & 0x3ffffff] >> (uVar15 & 0x3f) & 1) != 0) {
              local_194.label = this->LOSS;
              local_194.v = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar15];
              iVar3._M_current =
                   (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_194.u = iVar11;
              if (iVar3._M_current ==
                  (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                          (&this->A,iVar3,&local_194);
              }
              else {
                (iVar3._M_current)->label = local_194.label;
                (iVar3._M_current)->u = iVar11;
                (iVar3._M_current)->v = local_194.v;
                ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppAVar1 = *ppAVar1 + 1;
              }
              uVar13 = (ulong)(uint)(this->inst).nbtypes;
            }
            uVar15 = uVar15 + 1;
          } while ((long)uVar15 < (long)(int)uVar13);
        }
      }
    }
    if ((void *)CONCAT44(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (uint)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_168.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)local_168.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
    }
  }
  uVar18 = (this->inst).nbtypes;
  uVar13 = (ulong)uVar18;
  if (0 < (int)uVar18) {
    lVar20 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(local_138,(long)(int)uVar13,false);
      piVar25 = local_150.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar20].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar5 = local_150.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar22 = piVar25;
      if (piVar25 != piVar5) {
        do {
          iVar11 = *piVar22;
          iVar12 = iVar11 + 0x3f;
          if (-1 < (long)iVar11) {
            iVar12 = iVar11;
          }
          local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [(long)(iVar12 >> 6) +
           ((ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
               local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar12 >> 6) +
                ((ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
               1L << ((byte)iVar11 & 0x3f);
          piVar22 = piVar22 + 1;
        } while (piVar22 != piVar5);
        piVar22 = piVar25;
        if (piVar25 != piVar5) {
          do {
            iVar11 = *piVar22;
            uVar13 = (ulong)iVar11;
            iVar12 = iVar11 + 0x3f;
            if (-1 < (long)uVar13) {
              iVar12 = iVar11;
            }
            if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar12 >> 6) +
                  ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar13 & 0x3f) & 1) != 0) {
              piVar7 = local_150.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
              for (piVar24 = local_150.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start; piVar24 != piVar7;
                  piVar24 = piVar24 + 1) {
                iVar11 = *piVar24;
                iVar12 = iVar11 + 0x3f;
                if (-1 < (long)iVar11) {
                  iVar12 = iVar11;
                }
                bVar14 = (byte)iVar11 & 0x3f;
                local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [(long)(iVar12 >> 6) +
                 ((ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                     local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)(iVar12 >> 6) +
                      ((ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) - 1)] &
                     (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
              }
            }
            piVar22 = piVar22 + 1;
          } while (piVar22 != piVar5);
          for (; piVar25 != piVar5; piVar25 = piVar25 + 1) {
            iVar11 = *piVar25;
            uVar13 = (ulong)iVar11;
            iVar12 = iVar11 + 0x3f;
            if (-1 < (long)uVar13) {
              iVar12 = iVar11;
            }
            if ((local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar12 >> 6) +
                  ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                 (uVar13 & 0x3f) & 1) != 0) {
              piVar8 = (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = this->LOSS;
              local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = piVar8[lVar20];
              local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = piVar8[uVar13];
              iVar3._M_current =
                   (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                          (&this->A,iVar3,(Arc *)&local_168);
              }
              else {
                (iVar3._M_current)->label =
                     (int)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                (iVar3._M_current)->u =
                     (uint)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                (iVar3._M_current)->v =
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_;
                ppAVar1 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppAVar1 = *ppAVar1 + 1;
              }
            }
          }
        }
      }
      lVar20 = lVar20 + 1;
      uVar13 = (ulong)(this->inst).nbtypes;
    } while (lVar20 < (long)uVar13);
  }
  if (local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_138[0].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_150);
  if (local_188._M_current != (int *)0x0) {
    operator_delete(local_188._M_current);
  }
LAB_0010a85f:
  reduce_redundancy(this);
  iVar11 = NodeSet::size(&this->NS);
  pAVar16 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pAVar9 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  this->NV = (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) + iVar11;
  this->NA = (int)((ulong)((long)pAVar9 - (long)pAVar16) >> 2) * -0x55555555;
  if (pAVar9 != pAVar16) {
    iVar11 = this->LOSS;
    pIVar10 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (pAVar16->label != iVar11) {
        pAVar16->label = pIVar10[pAVar16->label].id;
      }
      pAVar16 = pAVar16 + 1;
    } while (pAVar16 != pAVar9);
  }
  this->ready = true;
  return;
}

Assistant:

void Arcflow::finalize() {
	throw_assert(ready == false);
	if (inst.nbtypes == 1) {
		S = 0;
		Ts.assign({NS.size()});
		A.push_back(Arc(Ts[0], S, LOSS));
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			A.push_back(Arc(i, Ts[0], LOSS));
		}
	} else {
		S = 0;
		std::vector<int> torder;
		for (int i = 0; i < inst.nbtypes; i++) {
			torder.push_back(i);
		}
		sort(all(torder), [this](int a, int b) {
			return this->inst.Ws[a] < this->inst.Ws[b];
		});
		Ts.resize(inst.nbtypes);
		for (int i = 0; i < inst.nbtypes; i++) {
			Ts[torder[i]] = NS.size() + i;
		}
		for (int i = 0; i < inst.nbtypes; i++) {
			A.push_back(Arc(Ts[i], S, LOSS));
		}

		std::vector<std::vector<int>> bigger_than(inst.nbtypes);
		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			for (int t2 = 0; t2 < inst.nbtypes; t2++) {
				if (t1 != t2 && is_valid(inst.Ws[t1], inst.Ws[t2])) {
					if (inst.Ws[t1] != inst.Ws[t2] ||
						(t1 < t2 && inst.Ws[t1] == inst.Ws[t2])) {
						bigger_than[t1].push_back(t2);
					}
				}
			}
		}

		std::vector<bool> valid_tgts(inst.nbtypes);
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			const std::vector<int> &u = NS.get_label(i);
			for (int t = 0; t < inst.nbtypes; t++) {
				valid_tgts[t] = is_valid(u, inst.Ws[t]);
			}
			for (int t1 = 0; t1 < inst.nbtypes; t1++) {
				if (valid_tgts[t1]) {
					for (int t2 : bigger_than[t1]) {
						valid_tgts[t2] = false;
					}
				}
			}
			for (int t = 0; t < inst.nbtypes; t++) {
				if (valid_tgts[t]) {
					A.push_back(Arc(i, Ts[t], LOSS));
				}
			}
		}

		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			valid_tgts.assign(inst.nbtypes, false);
			for (int t2 : bigger_than[t1]) {
				valid_tgts[t2] = true;
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					for (int t3 : bigger_than[t2]) {
						valid_tgts[t3] = false;
					}
				}
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					A.push_back(Arc(Ts[t1], Ts[t2], LOSS));
				}
			}
		}
	}
	reduce_redundancy();
	NV = NS.size() + Ts.size();
	NA = A.size();
	for (Arc &a : A) {
		if (a.label != LOSS) {
			a.label = sitems[a.label].id;
		}
	}
	ready = true;
}